

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_map.cpp
# Opt level: O1

void __thiscall aim_t::AimTraverse(aim_t *this)

{
  double *pdVar1;
  uint uVar2;
  sector_t *psVar3;
  extsector_t *peVar4;
  F3DFloor **ppFVar5;
  long *plVar6;
  secplane_t *psVar7;
  AActor *t2;
  _func_int **pp_Var8;
  player_t *ppVar9;
  AWeapon *pAVar10;
  byte bVar11;
  int iVar12;
  ulong uVar13;
  intercept_t *in;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  DAngle *pDVar14;
  AimTarget *res;
  long lVar15;
  bool bVar16;
  bool bVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  int planestocheck;
  FPathTraverse it;
  FLineOpening open;
  DVector2 local_198;
  secplane_t **local_188;
  AimTarget *local_180;
  double local_178;
  AimTarget *local_170;
  AimTarget *local_168;
  DAngle local_160;
  DAngle local_158;
  DAngle local_150;
  DAngle local_148;
  DAngle local_140;
  DAngle local_138;
  DAngle local_130;
  DAngle local_128;
  FPathTraverse local_120;
  DAngle local_e0;
  DAngle local_d8;
  DAngle local_d0;
  DAngle local_c8;
  FLineOpening local_c0;
  
  *(undefined8 *)&(this->linetarget).super_FTranslatedLineTarget.unlinked = 0;
  (this->linetarget).pitch.Degrees = 0.0;
  (this->linetarget).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->linetarget).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  (this->linetarget).frac = 3.4028234663852886e+38;
  (this->thing_friend).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_friend).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_friend).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_friend).pitch.Degrees = 0.0;
  (this->thing_friend).frac = 3.4028234663852886e+38;
  (this->thing_other).super_FTranslatedLineTarget.linetarget = (AActor *)0x0;
  (this->thing_other).super_FTranslatedLineTarget.angleFromSource.Degrees = 0.0;
  *(undefined8 *)&(this->thing_other).super_FTranslatedLineTarget.unlinked = 0;
  (this->thing_other).pitch.Degrees = 0.0;
  (this->thing_other).frac = 3.4028234663852886e+38;
  psVar3 = this->lastsector;
  peVar4 = psVar3->e;
  uVar13 = (ulong)(peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count;
  this->crossedffloors = uVar13 != 0;
  this->lastfloorplane = (secplane_t *)0x0;
  this->lastceilingplane = (secplane_t *)0x0;
  bVar16 = false;
  if (((this->aimdir & 1U) != 0) &&
     (bVar16 = false, (this->toppitch).Degrees <= 0.0 && (this->toppitch).Degrees != 0.0)) {
    bVar16 = (psVar3->planes[1].Flags & 0x1d0U) == 0x100;
  }
  bVar17 = false;
  if (((this->aimdir & 2U) != 0) && (bVar17 = false, 0.0 < (this->bottompitch).Degrees)) {
    bVar17 = (psVar3->planes[0].Flags & 0x1d0U) == 0x100;
  }
  local_188 = &this->lastfloorplane;
  if (uVar13 != 0) {
    ppFVar5 = (peVar4->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Array;
    dVar19 = (this->startpos).X;
    dVar20 = (this->startpos).Y;
    dVar18 = (this->startpos).Z;
    lVar15 = 0;
    do {
      plVar6 = *(long **)((long)ppFVar5 + lVar15);
      if ((*(uint *)(plVar6 + 0xb) & 0x4000001) == 1) {
        psVar7 = (secplane_t *)*plVar6;
        if (this->shootthing->Height + dVar18 <=
            ((psVar7->normal).Y * dVar20 + (psVar7->normal).X * dVar19 + psVar7->D) * psVar7->negiC)
        {
          this->lastceilingplane = psVar7;
          bVar16 = false;
        }
        psVar7 = (secplane_t *)plVar6[5];
        if (((psVar7->normal).Y * dVar20 + (psVar7->normal).X * dVar19 + psVar7->D) * psVar7->negiC
            <= dVar18) {
          *local_188 = psVar7;
          bVar17 = false;
        }
      }
      lVar15 = lVar15 + 8;
    } while (uVar13 << 3 != lVar15);
  }
  if (bVar16) {
    local_c8.Degrees = (this->toppitch).Degrees;
    dVar19 = (this->bottompitch).Degrees;
    local_d0.Degrees = 0.0;
    if (dVar19 <= 0.0) {
      local_d0.Degrees = dVar19;
    }
    EnterSectorPortal(this,1,0.0,psVar3,&local_c8,&local_d0);
  }
  if (bVar17) {
    dVar19 = (this->toppitch).Degrees;
    local_d8.Degrees = 0.0;
    if (0.0 <= dVar19) {
      local_d8.Degrees = dVar19;
    }
    local_e0.Degrees = (this->bottompitch).Degrees;
    EnterSectorPortal(this,0,0.0,this->lastsector,&local_d8,&local_e0);
  }
  local_120._vptr_FPathTraverse = (_func_int **)&PTR_AddLineIntercepts_0084b268;
  FPathTraverse::init(&local_120,(EVP_PKEY_CTX *)0xf);
  if (aimdebug.Value == true) {
    Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
           (this->startpos).X * 1.52587890625e-05,(this->startpos).Y * 1.52587890625e-05,
           (this->startpos).Z * 1.52587890625e-05,(this->aimtrace).X * 1.52587890625e-05,
           (this->aimtrace).Y * 1.52587890625e-05);
  }
  local_180 = &this->linetarget;
  local_168 = &this->thing_friend;
  local_170 = &this->thing_other;
  do {
    in = FPathTraverse::Next(&local_120);
    if (in == (intercept_t *)0x0) break;
    if (((local_180->super_FTranslatedLineTarget).linetarget == (AActor *)0x0) ||
       (bVar11 = 1, pdVar1 = &(this->linetarget).frac, in->frac < *pdVar1 || in->frac == *pdVar1)) {
      t2 = (in->d).thing;
      if (in->isaline == true) {
        pp_Var8 = (t2->super_DThinker).super_DObject._vptr_DObject;
        dVar19 = ((double)*pp_Var8 - (this->startpos).X) *
                 (double)(t2->super_DThinker).super_DObject.GCNext +
                 ((this->startpos).Y - (double)pp_Var8[1]) *
                 (double)(t2->super_DThinker).super_DObject.ObjNext;
        if (aimdebug.Value == true) {
          Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n",(this->toppitch).Degrees,
                 (this->bottompitch).Degrees);
        }
        uVar2 = *(uint *)&(t2->Angles).Yaw.Degrees;
        if (uVar2 < linePortals.Count) {
          bVar11 = (linePortals.Array[uVar2].mFlags & 2) >> 1;
        }
        else {
          bVar11 = 0;
        }
        if ((bVar11 == 0) || (1.52587890625e-05 < dVar19)) {
          bVar11 = 1;
          if (((t2->super_DThinker).super_DObject.ObjectFlags & 0x8004) == 4) {
            local_198.X = local_120.trace.dx * in->frac + local_120.trace.x;
            local_198.Y = in->frac * local_120.trace.dy + local_120.trace.y;
            P_LineOpening(&local_c0,(AActor *)0x0,(line_t *)t2,&local_198,(DVector2 *)0x0,0x100);
            bVar11 = 1;
            if ((0.0 < local_c0.range) && (local_c0.bottom < local_c0.top)) {
              dVar20 = this->attackrange * in->frac;
              if ((local_c0.bottom != -3.4028234663852886e+38) || (NAN(local_c0.bottom))) {
                local_178 = dVar20;
                dVar18 = c_atan2(local_c0.bottom - this->shootz,dVar20);
                dVar20 = local_178;
                if (dVar18 * -57.29577951308232 < (this->bottompitch).Degrees) {
                  (this->bottompitch).Degrees = dVar18 * -57.29577951308232;
                }
              }
              if ((local_c0.top != 3.4028234663852886e+38) || (NAN(local_c0.top))) {
                dVar20 = c_atan2(local_c0.top - this->shootz,dVar20);
                dVar20 = dVar20 * -57.29577951308232;
                if ((this->toppitch).Degrees <= dVar20 && dVar20 != (this->toppitch).Degrees) {
                  (this->toppitch).Degrees = dVar20;
                }
              }
              if ((this->toppitch).Degrees < (this->bottompitch).Degrees) {
                bVar16 = AimTraverse3DFloors(this,&local_120.trace,in,
                                             (uint)(1.52587890625e-05 < dVar19),(int *)&local_198);
                bVar11 = 1;
                if (bVar16) {
                  if (aimdebug.Value == true) {
                    Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n",
                           (this->toppitch).Degrees,(this->bottompitch).Degrees,
                           (ulong)(uint)((int)((ulong)((long)t2 - (long)lines) >> 3) * 0x286bca1b),
                           (ulong)local_198.X & 0xffffffff);
                  }
                  psVar3 = (sector_t *)(&t2->SpriteAngle)[dVar19 <= 1.52587890625e-05].Degrees;
                  this->lastsector = psVar3;
                  if ((((((ulong)local_198.X & 1) != 0) &&
                       (dVar19 = (this->toppitch).Degrees, dVar19 < 0.0)) &&
                      ((local_c0.top != 3.4028234663852886e+38 || (NAN(local_c0.top))))) &&
                     ((psVar3->planes[1].Flags & 0x1d0U) == 0x100)) {
                    dVar20 = (this->bottompitch).Degrees;
                    local_130.Degrees = 0.0;
                    if (dVar20 <= 0.0) {
                      local_130.Degrees = dVar20;
                    }
                    local_128.Degrees = dVar19;
                    EnterSectorPortal(this,1,in->frac,psVar3,&local_128,&local_130);
                  }
                  bVar11 = 0;
                  if (((((ulong)local_198.X & 2) != 0) &&
                      (dVar19 = (this->bottompitch).Degrees, 0.0 < dVar19)) &&
                     (((local_c0.bottom != -3.4028234663852886e+38 || (NAN(local_c0.bottom))) &&
                      ((psVar3->planes[0].Flags & 0x1d0U) == 0x100)))) {
                    dVar20 = (this->toppitch).Degrees;
                    local_138.Degrees = 0.0;
                    if (0.0 <= dVar20) {
                      local_138.Degrees = dVar20;
                    }
                    local_140.Degrees = dVar19;
                    EnterSectorPortal(this,0,in->frac,psVar3,&local_138,&local_140);
                  }
                }
              }
            }
          }
        }
        else {
          bVar11 = 1;
          EnterLinePortal(this,(line_t *)t2,in->frac);
        }
      }
      else {
        bVar11 = 0;
        if ((t2 != this->shootthing) && (this->aimtarget == (AActor *)0x0 || t2 == this->aimtarget))
        {
          uVar2 = this->flags;
          if ((uVar2 & 8) == 0) {
            if ((uVar2 & 4) == 0) {
LAB_00518afa:
              if ((((t2->flags).Value & 4) == 0) ||
                 ((((((t2->flags3).Value & 8) != 0 &&
                    (ppVar9 = this->shootthing->player, ppVar9 != (player_t *)0x0)) &&
                   (pAVar10 = ppVar9->ReadyWeapon, pAVar10 != (AWeapon *)0x0)) &&
                  (((pAVar10->super_AInventory).super_AActor.flags2.Value & 0x4000) != 0))))
              goto LAB_0051905b;
            }
          }
          else if (((uVar2 & 4) == 0) && (t2->Conversation == (FStrifeDialogueNode *)0x0))
          goto LAB_00518afa;
          dVar19 = this->attackrange * in->frac;
          if ((cl_doautoaim.Value != false) || (((t2->flags6).Value & 0x20000000) == 0)) {
            if ((this->lastsector == t2->Sector) &&
               ((t2->Sector->e->XFloor).ffloors.super_TArray<F3DFloor_*,_F3DFloor_*>.Count != 0)) {
              psVar7 = this->lastceilingplane;
              if (psVar7 != (secplane_t *)0x0) {
                dVar20 = c_atan2(((psVar7->normal).Y * (t2->__Pos).Y +
                                 (psVar7->normal).X * (t2->__Pos).X + psVar7->D) * psVar7->negiC -
                                 this->shootz,dVar19);
                dVar20 = dVar20 * -57.29577951308232;
                if ((this->toppitch).Degrees <= dVar20 && dVar20 != (this->toppitch).Degrees) {
                  (this->toppitch).Degrees = dVar20;
                }
              }
              psVar7 = *local_188;
              if (psVar7 != (secplane_t *)0x0) {
                dVar20 = c_atan2(((psVar7->normal).Y * (t2->__Pos).Y +
                                 (psVar7->normal).X * (t2->__Pos).X + psVar7->D) * psVar7->negiC -
                                 this->shootz,dVar19);
                if (dVar20 * -57.29577951308232 < (this->bottompitch).Degrees) {
                  (this->bottompitch).Degrees = dVar20 * -57.29577951308232;
                }
              }
            }
            dVar20 = c_atan2(((t2->__Pos).Z + t2->Height) - this->shootz,dVar19);
            dVar20 = dVar20 * -57.29577951308232;
            if (dVar20 < (this->bottompitch).Degrees || dVar20 == (this->bottompitch).Degrees) {
              dVar19 = c_atan2((t2->__Pos).Z - this->shootz,dVar19);
              dVar19 = dVar19 * -57.29577951308232;
              if ((this->toppitch).Degrees <= dVar19) {
                if (((this->crossedffloors != true) || (this->unlinked != false)) ||
                   (bVar16 = P_CheckSight(this->shootthing,t2,9), bVar16)) {
                  dVar18 = (this->toppitch).Degrees;
                  dVar21 = (this->bottompitch).Degrees;
                  if (dVar18 <= dVar20) {
                    dVar18 = dVar20;
                  }
                  if (dVar19 <= dVar21) {
                    dVar21 = dVar19;
                  }
                  dVar19 = dVar21 * 0.5 + dVar18 * 0.5;
                  if ((this->flags & 2) != 0) {
                    dVar20 = FFastTrig::cos(&fasttrig,
                                            dVar19 * 11930464.711111112 + 6755399441055744.0);
                    if ((dVar20 != 0.0) || (NAN(dVar20))) {
                      dVar18 = c_sqrt(local_120.trace.dy * local_120.trace.dy +
                                      local_120.trace.dx * local_120.trace.dx);
                      dVar20 = (dVar18 * in->frac) / dVar20;
                      bVar11 = 1;
                      if (this->attackrange <= dVar20 && dVar20 != this->attackrange)
                      goto LAB_0051905b;
                    }
                  }
                  if ((this->flags & 0x10) != 0) {
                    bVar16 = AActor::IsFriend(t2,this->friender);
                    bVar11 = 0;
                    if (bVar16 && this->aimtarget == (AActor *)0x0) goto LAB_0051905b;
                  }
                  if (((sv_smartaim.Value == 0) || ((this->flags & 1) != 0)) ||
                     (this->aimtarget != (AActor *)0x0)) {
                    if (aimdebug.Value == true) {
                      if ((t2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                        iVar12 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                        (t2->super_DThinker).super_DObject.Class =
                             (PClass *)CONCAT44(extraout_var_00,iVar12);
                      }
                      Printf("Hit target %s at %f,%f,%f\n",(t2->__Pos).X,(t2->__Pos).Y,
                             FName::NameData.NameArray
                             [(((t2->super_DThinker).super_DObject.Class)->super_PStruct).
                              super_PNamedType.TypeName.Index].Text);
                    }
                    dVar20 = in->frac;
                    pDVar14 = &local_160;
                    local_160.Degrees = dVar19;
LAB_00518edb:
                    bVar11 = 1;
                    SetResult(this,local_180,dVar20,t2,pDVar14);
                  }
                  else {
                    bVar16 = AActor::IsFriend(t2,this->friender);
                    if (bVar16) {
                      if (sv_smartaim.Value < 2) {
                        if (aimdebug.Value == true) {
                          if ((t2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                            iVar12 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                            (t2->super_DThinker).super_DObject.Class =
                                 (PClass *)CONCAT44(extraout_var,iVar12);
                          }
                          Printf("Hit friend %s at %f,%f,%f\n",(t2->__Pos).X,(t2->__Pos).Y,
                                 FName::NameData.NameArray
                                 [(((t2->super_DThinker).super_DObject.Class)->super_PStruct).
                                  super_PNamedType.TypeName.Index].Text);
                        }
                        dVar20 = in->frac;
                        pDVar14 = &local_148;
                        res = local_168;
                        local_148.Degrees = dVar19;
LAB_00518d92:
                        SetResult(this,res,dVar20,t2,pDVar14);
                      }
                    }
                    else {
                      if ((((t2->flags3).Value & 0x2000) != 0) || (t2->player != (player_t *)0x0)) {
                        if (aimdebug.Value == true) {
                          if ((t2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                            iVar12 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                            (t2->super_DThinker).super_DObject.Class =
                                 (PClass *)CONCAT44(extraout_var_01,iVar12);
                          }
                          Printf("Hit target %s at %f,%f,%f\n",(t2->__Pos).X,(t2->__Pos).Y,
                                 FName::NameData.NameArray
                                 [(((t2->super_DThinker).super_DObject.Class)->super_PStruct).
                                  super_PNamedType.TypeName.Index].Text);
                        }
                        dVar20 = in->frac;
                        pDVar14 = &local_158;
                        local_158.Degrees = dVar19;
                        goto LAB_00518edb;
                      }
                      if (sv_smartaim.Value < 3) {
                        if (aimdebug.Value == true) {
                          if ((t2->super_DThinker).super_DObject.Class == (PClass *)0x0) {
                            iVar12 = (**(t2->super_DThinker).super_DObject._vptr_DObject)(t2);
                            (t2->super_DThinker).super_DObject.Class =
                                 (PClass *)CONCAT44(extraout_var_02,iVar12);
                          }
                          Printf("Hit other %s at %f,%f,%f\n",(t2->__Pos).X,(t2->__Pos).Y,
                                 FName::NameData.NameArray
                                 [(((t2->super_DThinker).super_DObject.Class)->super_PStruct).
                                  super_PNamedType.TypeName.Index].Text);
                        }
                        dVar20 = in->frac;
                        pDVar14 = &local_150;
                        res = local_170;
                        local_150.Degrees = dVar19;
                        goto LAB_00518d92;
                      }
                    }
                    bVar11 = 0;
                  }
                }
                else {
                  dVar18 = (this->toppitch).Degrees;
                  if (dVar18 <= dVar20) {
                    dVar18 = (this->bottompitch).Degrees;
                    if ((dVar18 < dVar19) && (dVar20 < dVar18)) {
                      (this->bottompitch).Degrees = dVar20;
                    }
                  }
                  else if (dVar18 < dVar19) {
                    (this->toppitch).Degrees = dVar19;
                  }
                  dVar19 = (this->bottompitch).Degrees;
                  bVar11 = ((this->toppitch).Degrees <= dVar19 && dVar19 != (this->toppitch).Degrees
                           ) * '\x03' + 1;
                }
              }
            }
          }
        }
      }
    }
LAB_0051905b:
  } while ((bVar11 & 3) == 0);
  FPathTraverse::~FPathTraverse(&local_120);
  return;
}

Assistant:

void AimTraverse()
	{
		// for smart aiming
		linetarget.Clear();
		thing_friend.Clear();
		thing_other.Clear();
		crossedffloors = lastsector->e->XFloor.ffloors.Size() != 0;
		lastfloorplane = lastceilingplane = NULL;

		// check the initial sector for 3D-floors and portals
		bool ceilingportalstate = (aimdir & aim_t::aim_up) && toppitch < 0 && !lastsector->PortalBlocksMovement(sector_t::ceiling);
		bool floorportalstate = (aimdir & aim_t::aim_down) && bottompitch > 0 && !lastsector->PortalBlocksMovement(sector_t::floor);

		for (auto rover : lastsector->e->XFloor.ffloors)
		{
			if ((rover->flags & FF_SHOOTTHROUGH) || !(rover->flags & FF_EXISTS)) continue;

			double bottomz = rover->bottom.plane->ZatPoint(startpos);

			if (bottomz >= startpos.Z + shootthing->Height)
			{
				lastceilingplane = rover->bottom.plane;
				// no ceiling portal if below a 3D floor
				ceilingportalstate = false;
			}

			bottomz = rover->top.plane->ZatPoint(startpos);
			if (bottomz <= startpos.Z)
			{
				lastfloorplane = rover->top.plane;
				// no floor portal if above a 3D floor
				floorportalstate = false;
			}
		}
		if (ceilingportalstate) EnterSectorPortal(sector_t::ceiling, 0, lastsector, toppitch, MIN<DAngle>(0., bottompitch));
		if (floorportalstate) EnterSectorPortal(sector_t::floor, 0, lastsector, MAX<DAngle>(0., toppitch), bottompitch);

		FPathTraverse it(startpos.X, startpos.Y, aimtrace.X, aimtrace.Y, PT_ADDLINES | PT_ADDTHINGS | PT_COMPATIBLE | PT_DELTA, startfrac);
		intercept_t *in;

		if (aimdebug)
			Printf("Start AimTraverse, start = %f,%f,%f, vect = %f,%f\n",
				startpos.X / 65536., startpos.Y / 65536., startpos.Z / 65536.,
				aimtrace.X / 65536., aimtrace.Y / 65536.);
		
		while ((in = it.Next()))
		{
			line_t* 			li;
			AActor* 			th;
			DAngle	 			pitch;
			DAngle				thingtoppitch;
			DAngle 				thingbottompitch;
			double 				dist;
			DAngle				thingpitch;

			if (linetarget.linetarget != NULL && in->frac > linetarget.frac) return;	// we already found something better in another portal section.

			if (in->isaline)
			{
				li = in->d.line;
				int frontflag = P_PointOnLineSidePrecise(startpos, li);

				if (aimdebug)
					Printf("Found line %d: ___toppitch = %f, ___bottompitch = %f\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees);

				if (li->isLinePortal() && frontflag == 0)
				{
					EnterLinePortal(li, in->frac);
					return;
				}


				if (!(li->flags & ML_TWOSIDED) || (li->flags & ML_BLOCKEVERYTHING))
					return;				// stop

				// Crosses a two sided line.
				// A two sided line will restrict the possible target ranges.
				FLineOpening open;
				P_LineOpening(open, NULL, li, it.InterceptPoint(in), (DVector2*)nullptr, FFCF_NODROPOFF);

				// The following code assumes that portals on the front of the line have already been processed.

				if (open.range <= 0 || open.bottom >= open.top)
					return;
					
				dist = attackrange * in->frac;

				if (open.bottom != LINEOPEN_MIN)
				{
					pitch = -VecToAngle(dist, open.bottom - shootz);
					if (pitch < bottompitch) bottompitch = pitch;
				}

				if (open.top != LINEOPEN_MAX)
				{
					pitch = -VecToAngle(dist, open.top - shootz);
					if (pitch > toppitch) toppitch = pitch;
				}

				if (toppitch >= bottompitch)
					return;

				int planestocheck;
				if (!AimTraverse3DFloors(it.Trace(), in, frontflag, &planestocheck))
					return;

				if (aimdebug)
					Printf("After line %d: toppitch = %f, bottompitch = %f, planestocheck = %d\n", int(li - lines), toppitch.Degrees, bottompitch.Degrees, planestocheck);

				sector_t *entersec = frontflag ? li->frontsector : li->backsector;
				sector_t *exitsec = frontflag ? li->backsector : li->frontsector;
				lastsector = entersec;
				// check portal in backsector when aiming up/downward is possible, the line doesn't have portals on both sides and there's actually a portal in the backsector
				if ((planestocheck & aim_up) && toppitch < 0 && open.top != LINEOPEN_MAX && !entersec->PortalBlocksMovement(sector_t::ceiling))
				{
					EnterSectorPortal(sector_t::ceiling, in->frac, entersec, toppitch, MIN<DAngle>(0., bottompitch));
				}
				if ((planestocheck & aim_down) && bottompitch > 0 && open.bottom != LINEOPEN_MIN && !entersec->PortalBlocksMovement(sector_t::floor))
				{
					EnterSectorPortal(sector_t::floor, in->frac, entersec, MAX<DAngle>(0., toppitch), bottompitch);
				}
				continue;					// shot continues
			}

			// shoot a thing
			th = in->d.thing;
			if (th == shootthing)
				continue;					// can't shoot self

			if (aimtarget != NULL && th != aimtarget)
				continue;					// only care about target, and you're not it

			// If we want to start a conversation anything that has one should be
			// found, regardless of other settings.
			if (!(flags & ALF_CHECKCONVERSATION) || th->Conversation == NULL)
			{
				if (!(flags & ALF_CHECKNONSHOOTABLE))			// For info CCMD, ignore stuff about GHOST and SHOOTABLE flags
				{
					if (!(th->flags&MF_SHOOTABLE))
						continue;					// corpse or something

					// check for physical attacks on a ghost
					if ((th->flags3 & MF3_GHOST) &&
						shootthing->player &&	// [RH] Be sure shootthing is a player
						shootthing->player->ReadyWeapon &&
						(shootthing->player->ReadyWeapon->flags2 & MF2_THRUGHOST))
					{
						continue;
					}
				}
			}
			dist = attackrange * in->frac;

			// Don't autoaim certain special actors
			if (!cl_doautoaim && th->flags6 & MF6_NOTAUTOAIMED)
			{
				continue;
			}

			// we must do one last check whether the trace has crossed a 3D floor
			if (lastsector == th->Sector && th->Sector->e->XFloor.ffloors.Size())
			{
				if (lastceilingplane)
				{
					double ff_top = lastceilingplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_top - shootz);
					// upper slope intersects with this 3d-floor
					if (pitch > toppitch)
					{
						toppitch = pitch;
					}
				}
				if (lastfloorplane)
				{
					double ff_bottom = lastfloorplane->ZatPoint(th);
					DAngle pitch = -VecToAngle(dist, ff_bottom - shootz);
					// lower slope intersects with this 3d-floor
					if (pitch < bottompitch)
					{
						bottompitch = pitch;
					}
				}
			}

			// check angles to see if the thing can be aimed at

			thingtoppitch = -VecToAngle(dist, th->Top() - shootz);

			if (thingtoppitch > bottompitch)
				continue;					// shot over the thing

			thingbottompitch = -VecToAngle(dist, th->Z() - shootz);

			if (thingbottompitch < toppitch)
				continue;					// shot under the thing

			if (crossedffloors)
			{
				// if 3D floors were in the way do an extra visibility check for safety
				if (!unlinked && !P_CheckSight(shootthing, th, SF_IGNOREVISIBILITY | SF_IGNOREWATERBOUNDARY))
				{
					// the thing can't be seen so we can safely exclude its range from our aiming field
					if (thingtoppitch < toppitch)
					{
						if (thingbottompitch > toppitch) toppitch = thingbottompitch;
					}
					else if (thingbottompitch>bottompitch)
					{
						if (thingtoppitch < bottompitch) bottompitch = thingtoppitch;
					}
					if (toppitch < bottompitch) continue;
					else return;
				}
			}

			// this thing can be hit!
			if (thingtoppitch < toppitch)
				thingtoppitch = toppitch;

			if (thingbottompitch > bottompitch)
				thingbottompitch = bottompitch;

			thingpitch = thingtoppitch / 2 + thingbottompitch / 2;

			if (flags & ALF_CHECK3D)
			{
				// We need to do a 3D distance check here because this is nearly always used in
				// combination with P_LineAttack. P_LineAttack uses 3D distance but FPathTraverse
				// only 2D. This causes some problems with Hexen's weapons that use different
				// attack modes based on distance to target
				double cosine = thingpitch.Cos();
				if (cosine != 0)
				{
					double tracelen = DVector2(it.Trace().dx, it.Trace().dy).Length();
					double d3 = tracelen * in->frac / cosine;
					if (d3 > attackrange)
					{
						return;
					}
				}
			}

			if ((flags & ALF_NOFRIENDS) && th->IsFriend(friender) && aimtarget == NULL)
			{
				continue;
			}
			else if (sv_smartaim != 0 && !(flags & ALF_FORCENOSMART) && aimtarget == NULL)
			{
				// try to be a little smarter about what to aim at!
				// In particular avoid autoaiming at friends and barrels.
				if (th->IsFriend(friender))
				{
					if (sv_smartaim < 2)
					{
						// friends don't aim at friends (except players), at least not first
						if (aimdebug)
							Printf("Hit friend %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_friend, in->frac, th, thingpitch);
					}
				}
				else if (!(th->flags3 & MF3_ISMONSTER) && th->player == NULL)
				{
					if (sv_smartaim < 3)
					{
						// don't autoaim at barrels and other shootable stuff unless no monsters have been found
						if (aimdebug)
							Printf("Hit other %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
						SetResult(thing_other, in->frac, th, thingpitch);
					}
				}
				else
				{
					if (aimdebug)
						Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
					SetResult(linetarget, in->frac, th, thingpitch);
					return;
				}
			}
			else
			{
				if (aimdebug)
					Printf("Hit target %s at %f,%f,%f\n", th->GetClass()->TypeName.GetChars(), th->X(), th->Y(), th->Z());
				SetResult(linetarget, in->frac, th, thingpitch);
				return;
			}
		}
	}